

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O0

Results * __thiscall
testinator::TestRegistry::RunTest
          (Results *__return_storage_ptr__,TestRegistry *this,string *testName,RunParams *params,
          Outputter *outputter)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_bool>
  pVar3;
  _Base_ptr local_108;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  local_98;
  undefined1 local_70 [8];
  TestMap localMap;
  _Self local_38;
  iterator i;
  Outputter *outputter_local;
  RunParams *params_local;
  string *testName_local;
  TestRegistry *this_local;
  
  i._M_node = (_Base_ptr)outputter;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
       ::find(&this->m_tests,testName);
  localMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
               ::end(&this->m_tests);
  bVar1 = std::operator==(&local_38,
                          (_Self *)&localMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<testinator::Result,_std::allocator<testinator::Result>_>::vector
              (__return_storage_ptr__);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
           *)local_70);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
             ::operator->(&local_38);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
    ::pair<testinator::Test_*&,_true>(&local_98,testName,&ppVar2->second);
    pVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
                      *)local_70,&local_98);
    local_b8 = (_Base_ptr)pVar3.first._M_node;
    local_b0 = pVar3.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
    ::~pair(&local_98);
    bVar1 = i._M_node == (_Base_ptr)0x0;
    if (bVar1) {
      std::make_unique<testinator::Outputter>();
      local_108 = (_Base_ptr)
                  std::
                  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
                  get(&local_c0);
    }
    else {
      local_108 = i._M_node;
    }
    RunTests(__return_storage_ptr__,this,(TestMap *)local_70,params,(Outputter *)local_108);
    if (bVar1) {
      std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
      ~unique_ptr(&local_c0);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
            *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Results RunTest(const std::string& testName,
                    const RunParams& params = RunParams(),
                    const Outputter* outputter = nullptr)
    {
      auto i = m_tests.find(testName);
      if (i == m_tests.end())
        return std::vector<Result>();

      TestMap localMap;
      localMap.insert({testName, i->second});
      return RunTests(
          localMap,
          params,
          outputter != nullptr ? outputter : std::make_unique<Outputter>().get());
    }